

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::sendControlEvent(QLabelPrivate *this,QEvent *e)

{
  QWidgetTextControl *this_00;
  QWidget *contextWidget;
  long in_FS_OFFSET;
  QRectF local_58;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->field_0x340 & 0x10) == 0) ||
      (this_00 = (QWidgetTextControl *)this->control, this_00 == (QWidgetTextControl *)0x0)) ||
     ((this->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i == 0)) {
    e[0xc] = (QEvent)0x0;
  }
  else {
    contextWidget = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
    layoutRect(&local_58,this);
    local_38.xp._4_4_ = local_58.xp._4_4_ ^ 0x80000000;
    local_38.yp._4_4_ = local_58.yp._4_4_ ^ 0x80000000;
    local_38.xp._0_4_ = local_58.xp._0_4_;
    local_38.yp._0_4_ = local_58.yp._0_4_;
    QWidgetTextControl::processEvent(this_00,e,&local_38,contextWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::sendControlEvent(QEvent *e)
{
    Q_Q(QLabel);
    if (!isTextLabel || !control || textInteractionFlags == Qt::NoTextInteraction) {
        e->ignore();
        return;
    }
    control->processEvent(e, -layoutRect().topLeft(), q);
}